

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

bool cashew::JSPrinter::ifHasElse(Ref node)

{
  bool bVar1;
  Value *pVVar2;
  size_t sVar3;
  Ref *pRVar4;
  byte local_12;
  byte local_11;
  Ref local_10;
  Ref node_local;
  
  local_10.inst = node.inst;
  pVVar2 = Ref::operator->(&local_10);
  bVar1 = Value::isArray(pVVar2);
  local_11 = 0;
  if (bVar1) {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&local_10);
    local_11 = cashew::Ref::operator==(pRVar4,(IString *)&IF);
  }
  if ((local_11 & 1) != 0) {
    pVVar2 = Ref::operator->(&local_10);
    sVar3 = Value::size(pVVar2);
    local_12 = 0;
    if (3 < sVar3) {
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&local_10);
      local_12 = cashew::Ref::operator!(pRVar4);
      local_12 = local_12 ^ 0xff;
    }
    return (bool)(local_12 & 1);
  }
  __assert_fail("node->isArray() && node[0] == IF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x537,"static bool cashew::JSPrinter::ifHasElse(Ref)");
}

Assistant:

static bool ifHasElse(Ref node) {
    assert(node->isArray() && node[0] == IF);
    return node->size() >= 4 && !!node[3];
  }